

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_shift_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  MemOp memop;
  uint rd;
  MemOp memop_00;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGTemp *pTVar7;
  long shift;
  TCGv_i64 pTVar8;
  byte bVar9;
  byte bVar10;
  uintptr_t o;
  uint uVar11;
  uint uVar12;
  uint64_t pc;
  uint uVar13;
  TCGContext_conflict1 *pTVar14;
  bool bVar15;
  uint32_t uVar16;
  uint immb;
  uintptr_t o_2;
  uint uVar17;
  int iVar18;
  uint rn;
  int iVar19;
  int iVar20;
  _Bool _Var21;
  GVecGen2i_conflict1 *g;
  TCGv_i64 local_a0;
  uint local_98;
  uintptr_t o_5;
  uint local_88;
  ulong uVar2;
  
  uVar17 = insn >> 0x13 & 0xf;
  if (uVar17 == 0) {
    __assert_fail("immh != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x29a6,"void disas_simd_shift_imm(DisasContext *, uint32_t)");
  }
  uVar11 = insn >> 0xb & 0x1f;
  if (0x1f < uVar11) goto switchD_006ad774_caseD_1;
  rd = insn & 0x1f;
  uVar2 = (ulong)rd;
  rn = insn >> 5 & 0x1f;
  immb = insn >> 0x10 & 7;
  uVar13 = insn & 0x20000000;
  uVar12 = insn & 0x40000000;
  switch(uVar11) {
  case 0:
  case 2:
  case 4:
  case 6:
    goto switchD_006ad774_caseD_0;
  default:
    goto switchD_006ad774_caseD_1;
  case 8:
    if (uVar13 == 0) goto switchD_006ad774_caseD_1;
switchD_006ad774_caseD_0:
    local_98 = insn & 0x20000000;
    pTVar14 = s->uc->tcg_ctx;
    memop = MO_ALIGN_2|MO_BESL|MO_16;
    if (uVar17 != 0) {
      for (; uVar17 >> memop == 0; memop = memop - MO_16) {
      }
    }
    bVar9 = (byte)memop;
    iVar18 = 8 << (bVar9 & 0x1f);
    pTVar3 = new_tmp_a64_aarch64(s);
    pTVar4 = new_tmp_a64_aarch64(s);
    if ((insn & 0x40400000) == 0x400000) goto LAB_006adae9;
    if (s->fp_access_checked == true) {
LAB_006ae26d:
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    s->fp_access_checked = true;
    uVar16 = s->fp_excp_el;
    if (uVar16 != 0) {
      pc = s->pc_curr;
LAB_006adbfc:
      gen_exception_insn(s,pc,1,0x1fe0000a,uVar16);
      return;
    }
    if (8 < uVar11) {
switchD_006adb46_caseD_1:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x2900,(char *)0x0);
    }
    iVar19 = (0x10 << (bVar9 & 0x1f)) - (immb + uVar17 * 8);
    switch(uVar11) {
    case 0:
      if (local_98 == 0) {
        tcg_gen_gvec_sari_aarch64
                  (s->uc->tcg_ctx,memop,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,
                   (long)(int)(iVar19 - (uint)(iVar19 == iVar18)),(uint)(uVar12 != 0) * 8 + 8,
                   s->sve_len);
        return;
      }
      if (iVar19 != iVar18) {
        tcg_gen_gvec_shri_aarch64
                  (s->uc->tcg_ctx,memop,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,(long)iVar19,
                   (uint)(uVar12 != 0) * 8 + 8,s->sve_len);
        return;
      }
      tcg_gen_gvec_dup8i_aarch64
                (pTVar14,rd * 0x100 + 0xc10,(uint)(uVar12 != 0) * 8 + 8,s->sve_len,'\0');
      return;
    default:
      goto switchD_006adb46_caseD_1;
    case 2:
      if (local_98 != 0) {
        if (iVar19 != iVar18) {
          gen_gvec_op2i(s,uVar12 != 0,rd,rn,(long)iVar19,usra_op_aarch64 + memop);
          return;
        }
        goto LAB_006ae0d2;
      }
      shift = (long)(int)(iVar19 - (uint)(iVar19 == iVar18));
      g = ssra_op_aarch64 + memop;
      pTVar14 = s->uc->tcg_ctx;
      uVar16 = s->sve_len;
      break;
    case 4:
      _Var21 = false;
      goto LAB_006addf4;
    case 6:
      _Var21 = true;
LAB_006addf4:
      memop_00 = local_98 >> 0x1b ^ MO_ASHIFT | memop;
      pTVar8 = tcg_const_i64_aarch64(pTVar14,1L << ((char)iVar19 - 1U & 0x3f));
      uVar17 = 0;
      do {
        read_vec_element(s,pTVar3,rn,uVar17,memop_00);
        if (_Var21 != false) {
          read_vec_element(s,pTVar4,rd,uVar17,memop_00);
        }
        handle_shri_with_rndacc(pTVar14,pTVar4,pTVar3,pTVar8,_Var21,local_98 != 0,memop,iVar19);
        write_vec_element(s,pTVar4,rd,uVar17,memop);
        uVar17 = uVar17 + 1;
      } while ((uint)(uVar12 != 0) * 0x40 + 0x40 >> (0x22 - (bVar9 ^ 0x1f) & 0x1f) != uVar17);
      tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar8 + (long)pTVar14));
LAB_006ae0d2:
      clear_vec_high(s,uVar12 != 0,rd);
      return;
    case 8:
      if (iVar19 == iVar18) goto LAB_006ae0d2;
      shift = (long)iVar19;
      g = sri_op_aarch64 + memop;
      pTVar14 = s->uc->tcg_ctx;
      uVar16 = s->sve_len;
    }
LAB_006ae18f:
    tcg_gen_gvec_2i_aarch64
              (pTVar14,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,(uint)(uVar12 != 0) * 8 + 8,uVar16,
               shift,g);
    break;
  case 10:
    uVar11 = 0x1f;
    if (uVar17 != 0) {
      for (; uVar17 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    if ((insn & 0x40400000) == 0x400000) goto switchD_006ad774_caseD_1;
    if (s->fp_access_checked == true) goto LAB_006ae26d;
    s->fp_access_checked = true;
    uVar16 = s->fp_excp_el;
    if (uVar16 != 0) goto LAB_006adbf5;
    shift = (long)(int)(immb + uVar17 * 8 + (-8 << ((byte)uVar11 & 0x1f)));
    if (uVar13 == 0) {
      tcg_gen_gvec_shli_aarch64
                (s->uc->tcg_ctx,uVar11,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,shift,
                 (uint)(uVar12 != 0) * 8 + 8,s->sve_len);
      return;
    }
    g = sli_op_aarch64 + uVar11;
    pTVar14 = s->uc->tcg_ctx;
    uVar16 = s->sve_len;
    goto LAB_006ae18f;
  case 0xc:
    if (uVar13 != 0) {
      _Var21 = false;
      bVar15 = true;
      goto LAB_006ad940;
    }
    goto switchD_006ad774_caseD_1;
  case 0xe:
    _Var21 = uVar13 != 0;
    bVar15 = _Var21;
LAB_006ad940:
    handle_simd_qshl(s,false,uVar12 != 0,_Var21,bVar15,uVar17,immb,rn,rd);
    break;
  case 0x10:
  case 0x11:
    if (uVar13 != 0) {
      _Var21 = false;
      bVar15 = true;
      goto LAB_006ad876;
    }
    local_88 = 0x1f;
    if (uVar17 != 0) {
      for (; uVar17 >> local_88 == 0; local_88 = local_88 - 1) {
      }
    }
    bVar9 = (byte)local_88;
    bVar10 = 0x22 - (bVar9 ^ 0x1f);
    uVar11 = 0x40 >> (bVar10 & 0x1f);
    if ((insn >> 0x16 & 1) == 0) {
      local_88 = local_88 ^ 0x1f;
      if (s->fp_access_checked == true) goto LAB_006ae26d;
      pTVar14 = s->uc->tcg_ctx;
      s->fp_access_checked = true;
      uVar16 = s->fp_excp_el;
      if (uVar16 == 0) {
        iVar18 = (0x10 << (bVar9 & 0x1f)) - (immb + uVar17 * 8);
        iVar19 = 0;
        pTVar5 = tcg_temp_new_internal_aarch64(pTVar14,TCG_TYPE_I64,false);
        pTVar6 = tcg_temp_new_internal_aarch64(pTVar14,TCG_TYPE_I64,false);
        pTVar7 = tcg_temp_new_internal_aarch64(pTVar14,TCG_TYPE_I64,false);
        pTVar3 = (TCGv_i64)((long)pTVar7 - (long)pTVar14);
        pTVar1 = s->uc->tcg_ctx;
        iVar20 = rd * 0x100;
        tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)pTVar3),
                            (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                            (ulong)(iVar20 + (uVar12 >> 0x1b) + 0xc10));
        if ((insn >> 0xb & 1) == 0) {
          local_a0 = (TCGv_i64)0x0;
        }
        else {
          local_a0 = tcg_const_i64_aarch64(pTVar14,1L << ((char)iVar18 - 1U & 0x3f));
        }
        pTVar4 = (TCGv_i64)((long)pTVar5 - (long)pTVar14);
        pTVar8 = (TCGv_i64)((long)pTVar6 - (long)pTVar14);
        do {
          read_vec_element(s,pTVar4,rn,iVar19,MO_ALIGN_4 - local_88);
          handle_shri_with_rndacc
                    (pTVar14,pTVar8,pTVar4,local_a0,false,true,MO_ALIGN_4 - local_88,iVar18);
          tcg_gen_deposit_i64_aarch64
                    (pTVar14,pTVar3,pTVar3,pTVar8,iVar19 << (bVar10 & 0x1f),8 << (bVar9 & 0x1f));
          rd = (uint)uVar2;
          iVar19 = iVar19 + 1;
        } while (uVar11 + (uVar11 == 0) != iVar19);
        uVar17 = iVar20 + 0xc10;
        if (uVar12 != 0) {
          uVar17 = iVar20 + 0xc18;
        }
        pTVar1 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)((long)pTVar1 + (long)pTVar3),
                            (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)uVar17);
        if ((insn >> 0xb & 1) != 0) {
          tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(local_a0 + (long)pTVar14));
        }
        tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar4 + (long)pTVar14));
        tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar8 + (long)pTVar14));
        tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar3 + (long)pTVar14));
        goto LAB_006ae0d2;
      }
LAB_006adbf5:
      pc = s->pc_curr;
      goto LAB_006adbfc;
    }
switchD_006ad774_caseD_1:
LAB_006adae9:
    unallocated_encoding_aarch64(s);
    return;
  case 0x12:
  case 0x13:
    _Var21 = uVar13 != 0;
    bVar15 = _Var21;
LAB_006ad876:
    handle_vec_simd_sqshrn(s,false,uVar12 != 0,_Var21,bVar15,uVar17,immb,uVar11,rn,rd);
    break;
  case 0x14:
    local_98 = insn & 0x20000000;
    pTVar14 = s->uc->tcg_ctx;
    uVar11 = 0x1f;
    if (uVar17 != 0) {
      for (; uVar17 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    bVar9 = 0x22 - (char)(uVar11 ^ 0x1f);
    uVar13 = 0x40 >> (bVar9 & 0x1f);
    pTVar3 = new_tmp_a64_aarch64(s);
    pTVar4 = new_tmp_a64_aarch64(s);
    if (7 < uVar17) goto LAB_006adae9;
    if (s->fp_access_checked == true) goto LAB_006ae26d;
    s->fp_access_checked = true;
    uVar16 = s->fp_excp_el;
    if (uVar16 == 0) {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)(pTVar3 + (long)pTVar1),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (ulong)(rn * 0x100 + (uVar12 >> 0x1b) + 0xc10));
      iVar18 = 0;
      do {
        tcg_gen_shri_i64_aarch64(pTVar14,pTVar4,pTVar3,(long)(iVar18 << (bVar9 & 0x1f)));
        ext_and_shift_reg(pTVar14,pTVar4,pTVar4,uVar11 | local_98 >> 0x1b ^ 4,0);
        tcg_gen_shli_i64_aarch64
                  (pTVar14,pTVar4,pTVar4,
                   (long)(int)(immb + uVar17 * 8 + (-8 << ((byte)uVar11 & 0x1f))));
        write_vec_element(s,pTVar4,rd,iVar18,MO_ALIGN_4 - (uVar11 ^ 0x1f));
        iVar18 = iVar18 + 1;
      } while (uVar13 + (uVar13 == 0) != iVar18);
      return;
    }
    pc = s->pc_curr;
    goto LAB_006adbfc;
  case 0x1c:
    handle_simd_shift_intfp_conv(s,false,uVar12 != 0,uVar13 != 0,uVar17,immb,rn,rd,rd);
    break;
  case 0x1f:
    handle_simd_shift_fpint_conv(s,false,uVar12 != 0,uVar13 != 0,uVar17,immb,rn,rd);
  }
  return;
}

Assistant:

static void disas_simd_shift_imm(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 5);
    int immb = extract32(insn, 16, 3);
    int immh = extract32(insn, 19, 4);
    bool is_u = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);

    /* data_proc_simd[] has sent immh == 0 to disas_simd_mod_imm. */
    assert(immh != 0);

    switch (opcode) {
    case 0x08: /* SRI */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x00: /* SSHR / USHR */
    case 0x02: /* SSRA / USRA (accumulate) */
    case 0x04: /* SRSHR / URSHR (rounding) */
    case 0x06: /* SRSRA / URSRA (accum + rounding) */
        handle_vec_simd_shri(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x0a: /* SHL / SLI */
        handle_vec_simd_shli(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x10: /* SHRN */
    case 0x11: /* RSHRN / SQRSHRUN */
        if (is_u) {
            handle_vec_simd_sqshrn(s, false, is_q, false, true, immh, immb,
                                   opcode, rn, rd);
        } else {
            handle_vec_simd_shrn(s, is_q, immh, immb, opcode, rn, rd);
        }
        break;
    case 0x12: /* SQSHRN / UQSHRN */
    case 0x13: /* SQRSHRN / UQRSHRN */
        handle_vec_simd_sqshrn(s, false, is_q, is_u, is_u, immh, immb,
                               opcode, rn, rd);
        break;
    case 0x14: /* SSHLL / USHLL */
        handle_vec_simd_wshli(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x1c: /* SCVTF / UCVTF */
        handle_simd_shift_intfp_conv(s, false, is_q, is_u, immh, immb,
                                     opcode, rn, rd);
        break;
    case 0xc: /* SQSHLU */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_simd_qshl(s, false, is_q, false, true, immh, immb, rn, rd);
        break;
    case 0xe: /* SQSHL, UQSHL */
        handle_simd_qshl(s, false, is_q, is_u, is_u, immh, immb, rn, rd);
        break;
    case 0x1f: /* FCVTZS/ FCVTZU */
        handle_simd_shift_fpint_conv(s, false, is_q, is_u, immh, immb, rn, rd);
        return;
    default:
        unallocated_encoding(s);
        return;
    }
}